

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceTextureGather_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType samplerDataType,DataType pDataType,DataType thirdArgument)

{
  undefined4 uVar1;
  bool bVar2;
  RenderContext *pRVar3;
  ostream *poVar4;
  ShaderType shaderType_00;
  DataType dataType;
  char *local_318;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  deUint32 local_1b8;
  ContextType local_1a4;
  undefined1 local_1a0 [8];
  ostringstream source;
  DataType thirdArgument_local;
  DataType pDataType_local;
  DataType samplerDataType_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  source._368_4_ = pDataType;
  source._372_4_ = samplerDataType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pRVar3 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_1a4.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1b8 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_1a4,(ApiType)local_1b8);
  if (bVar2) {
    local_318 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_318 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar4 = std::operator<<((ostream *)local_1a0,local_318);
  poVar4 = std::operator<<(poVar4,"\n");
  getDataTypeExtension_abi_cxx11_(&local_1f8,(_anonymous_namespace_ *)(ulong)shaderType,dataType);
  NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_1d8,&local_1f8);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
  getShaderInitialization_abi_cxx11_
            (&local_218,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"sampler",&local_259);
  NegativeTestShared::anon_unknown_0::declareShaderUniform(&local_238,shaderType,&local_258);
  poVar4 = std::operator<<(poVar4,(string *)&local_238);
  poVar4 = std::operator<<(poVar4,"void main(void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tmediump ");
  uVar1 = source._372_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"P",&local_2a1);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_280,uVar1,&local_2a0);
  std::operator<<(poVar4,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  if (source._368_4_ == 0x5e) {
    std::operator<<((ostream *)local_1a0,"\ttextureGather(sampler, P);\n");
  }
  else {
    poVar4 = std::operator<<((ostream *)local_1a0,"\tmediump ");
    uVar1 = source._368_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"arg3",&local_2e9);
    NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
              (&local_2c8,uVar1,&local_2e8);
    poVar4 = std::operator<<(poVar4,(string *)&local_2c8);
    std::operator<<(poVar4,"\ttextureGather(sampler, P, arg3);\n");
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceTextureGather (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType samplerDataType, glu::DataType pDataType, glu::DataType thirdArgument)
{
	std::ostringstream source;

	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderExtensionDeclaration(getDataTypeExtension(samplerDataType))
			<< getShaderInitialization(ctx, shaderType)
			<< declareShaderUniform(samplerDataType, "sampler")
			<< "void main(void)\n"
			<< "{\n"
			<< "	mediump " << declareAndInitializeShaderVariable(pDataType, "P");

	if (thirdArgument != glu::TYPE_LAST)
		source	<< "	mediump " << declareAndInitializeShaderVariable(thirdArgument, "arg3")
				<< "	textureGather(sampler, P, arg3);\n";
	else
		source << "	textureGather(sampler, P);\n";

	source << "}\n";

	return source.str();
}